

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O1

Result * CoreML::validateInputCount
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,int min,int max)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  uint __uval_1;
  uint uVar10;
  uint uVar11;
  uint __uval;
  uint uVar12;
  string __str;
  string __str_1;
  string err;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188 [2];
  long *local_178;
  undefined8 local_170;
  long local_168;
  undefined8 uStack_160;
  long *local_158;
  undefined8 local_150;
  long local_148;
  undefined8 uStack_140;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98 [2];
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  Result *local_38;
  
  if (-1 < max && max < min) {
    __assert_fail("min <= max || max < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/src/Validation/NeuralNetwork/NeuralNetworkValidatorUtils.hpp"
                  ,0x62,
                  "Result CoreML::validateInputCount(const Specification::NeuralNetworkLayer &, int, int)"
                 );
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if ((max == min && 0 < max) && ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != max))
  {
    plVar3 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    local_98[0] = local_88;
    lVar1 = *plVar3;
    std::__cxx11::string::_M_construct<char*>((string *)local_98,lVar1,plVar3[1] + lVar1);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x3e2432);
    local_b8 = &local_a8;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_a8 = *plVar3;
      lStack_a0 = puVar4[3];
    }
    else {
      local_a8 = *plVar3;
      local_b8 = (long *)*puVar4;
    }
    local_b0 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_1b8 = &local_1a8;
    puVar8 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar8) {
      local_1a8 = *puVar8;
      lStack_1a0 = plVar3[3];
    }
    else {
      local_1a8 = *puVar8;
      local_1b8 = (ulong *)*plVar3;
    }
    local_1b0 = plVar3[1];
    *plVar3 = (long)puVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar10 = layer->_oneof_case_[0];
    uVar12 = -uVar10;
    if (0 < (int)uVar10) {
      uVar12 = uVar10;
    }
    uVar11 = 1;
    if (9 < uVar12) {
      uVar9 = (ulong)uVar12;
      uVar6 = 4;
      do {
        uVar11 = uVar6;
        uVar5 = (uint)uVar9;
        if (uVar5 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00374936;
        }
        if (uVar5 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00374936;
        }
        if (uVar5 < 10000) goto LAB_00374936;
        uVar9 = uVar9 / 10000;
        uVar6 = uVar11 + 4;
      } while (99999 < uVar5);
      uVar11 = uVar11 + 1;
    }
LAB_00374936:
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar11 - (char)((int)uVar10 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_1d8),uVar11,uVar12);
    uVar9 = 0xf;
    if (local_1b8 != &local_1a8) {
      uVar9 = local_1a8;
    }
    if (uVar9 < (ulong)(local_1d0 + local_1b0)) {
      uVar9 = 0xf;
      if (local_1d8 != local_1c8) {
        uVar9 = local_1c8[0];
      }
      if (uVar9 < (ulong)(local_1d0 + local_1b0)) goto LAB_003749ab;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1b8);
    }
    else {
LAB_003749ab:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_1d8);
    }
    local_178 = &local_168;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_168 = *plVar3;
      uStack_160 = puVar4[3];
    }
    else {
      local_168 = *plVar3;
      local_178 = (long *)*puVar4;
    }
    local_170 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    local_38 = __return_storage_ptr__;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_178);
    puVar8 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar8) {
      local_e8 = *puVar8;
      lStack_e0 = plVar3[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar8;
      local_f8 = (ulong *)*plVar3;
    }
    local_f0 = plVar3[1];
    *plVar3 = (long)puVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar10 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
    uVar12 = -uVar10;
    if (0 < (int)uVar10) {
      uVar12 = uVar10;
    }
    uVar11 = 1;
    if (9 < uVar12) {
      uVar9 = (ulong)uVar12;
      uVar6 = 4;
      do {
        uVar11 = uVar6;
        uVar5 = (uint)uVar9;
        if (uVar5 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00374ad9;
        }
        if (uVar5 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00374ad9;
        }
        if (uVar5 < 10000) goto LAB_00374ad9;
        uVar9 = uVar9 / 10000;
        uVar6 = uVar11 + 4;
      } while (99999 < uVar5);
      uVar11 = uVar11 + 1;
    }
LAB_00374ad9:
    local_198 = local_188;
    std::__cxx11::string::_M_construct((ulong)&local_198,(char)uVar11 - (char)((int)uVar10 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_198),uVar11,uVar12);
    uVar9 = 0xf;
    if (local_f8 != &local_e8) {
      uVar9 = local_e8;
    }
    if (uVar9 < (ulong)(local_190 + local_f0)) {
      uVar9 = 0xf;
      if (local_198 != local_188) {
        uVar9 = local_188[0];
      }
      if (uVar9 < (ulong)(local_190 + local_f0)) goto LAB_00374b51;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_00374b51:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_198);
    }
    local_158 = &local_148;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_148 = *plVar3;
      uStack_140 = puVar4[3];
    }
    else {
      local_148 = *plVar3;
      local_158 = (long *)*puVar4;
    }
    local_150 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_158);
    puVar8 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar8) {
      local_c8 = *puVar8;
      lStack_c0 = plVar3[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *puVar8;
      local_d8 = (ulong *)*plVar3;
    }
    local_d0 = plVar3[1];
    *plVar3 = (long)puVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar10 = -min;
    if (0 < min) {
      uVar10 = min;
    }
    uVar12 = 1;
    if (9 < uVar10) {
      uVar9 = (ulong)uVar10;
      uVar11 = 4;
      do {
        uVar12 = uVar11;
        uVar6 = (uint)uVar9;
        if (uVar6 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_00374c8e;
        }
        if (uVar6 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_00374c8e;
        }
        if (uVar6 < 10000) goto LAB_00374c8e;
        uVar9 = uVar9 / 10000;
        uVar11 = uVar12 + 4;
      } while (99999 < uVar6);
      uVar12 = uVar12 + 1;
    }
LAB_00374c8e:
    local_118 = local_108;
    std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar12 - (char)(min >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_118 + (ulong)((uint)min >> 0x1f)),uVar12,uVar10);
    uVar9 = 0xf;
    if (local_d8 != &local_c8) {
      uVar9 = local_c8;
    }
    if (uVar9 < (ulong)(local_110 + local_d0)) {
      uVar9 = 0xf;
      if (local_118 != local_108) {
        uVar9 = local_108[0];
      }
      if (uVar9 < (ulong)(local_110 + local_d0)) goto LAB_00374d18;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_00374d18:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_118);
    }
    local_138 = &local_128;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_128 = *plVar3;
      uStack_120 = puVar4[3];
    }
    else {
      local_128 = *plVar3;
      local_138 = (long *)*puVar4;
    }
    local_130 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_68 = *plVar7;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar7;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if (local_118 != local_108) {
      operator_delete(local_118,local_108[0] + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    __return_storage_ptr__ = local_38;
    if (local_178 != &local_168) {
LAB_00374ef8:
      operator_delete(local_178,local_168 + 1);
    }
LAB_00374f05:
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_98[0] != local_88) {
LAB_00374f76:
      operator_delete(local_98[0],local_88[0] + 1);
    }
  }
  else {
    if ((0 < min) && ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < min)) {
      plVar3 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_98[0] = local_88;
      lVar1 = *plVar3;
      std::__cxx11::string::_M_construct<char*>((string *)local_98,lVar1,plVar3[1] + lVar1);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x3e2432);
      local_b8 = &local_a8;
      plVar7 = plVar3 + 2;
      if ((long *)*plVar3 == plVar7) {
        local_a8 = *plVar7;
        lStack_a0 = plVar3[3];
      }
      else {
        local_a8 = *plVar7;
        local_b8 = (long *)*plVar3;
      }
      local_b0 = plVar3[1];
      *plVar3 = (long)plVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
      local_1b8 = &local_1a8;
      puVar8 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar8) {
        local_1a8 = *puVar8;
        lStack_1a0 = puVar4[3];
      }
      else {
        local_1a8 = *puVar8;
        local_1b8 = (ulong *)*puVar4;
      }
      local_1b0 = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      uVar10 = layer->_oneof_case_[0];
      uVar12 = -uVar10;
      if (0 < (int)uVar10) {
        uVar12 = uVar10;
      }
      uVar11 = 1;
      if (9 < uVar12) {
        uVar9 = (ulong)uVar12;
        uVar6 = 4;
        do {
          uVar11 = uVar6;
          uVar5 = (uint)uVar9;
          if (uVar5 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_00374fd6;
          }
          if (uVar5 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_00374fd6;
          }
          if (uVar5 < 10000) goto LAB_00374fd6;
          uVar9 = uVar9 / 10000;
          uVar6 = uVar11 + 4;
        } while (99999 < uVar5);
        uVar11 = uVar11 + 1;
      }
LAB_00374fd6:
      local_1d8 = local_1c8;
      std::__cxx11::string::_M_construct
                ((ulong)&local_1d8,(char)uVar11 - (char)((int)uVar10 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_1d8),uVar11,uVar12);
      uVar9 = 0xf;
      if (local_1b8 != &local_1a8) {
        uVar9 = local_1a8;
      }
      if (uVar9 < (ulong)(local_1d0 + local_1b0)) {
        uVar9 = 0xf;
        if (local_1d8 != local_1c8) {
          uVar9 = local_1c8[0];
        }
        if (uVar9 < (ulong)(local_1d0 + local_1b0)) goto LAB_0037504b;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1b8);
      }
      else {
LAB_0037504b:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_1d8);
      }
      local_178 = &local_168;
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_168 = *plVar3;
        uStack_160 = puVar4[3];
      }
      else {
        local_168 = *plVar3;
        local_178 = (long *)*puVar4;
      }
      local_170 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)plVar3 = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_178);
      puVar8 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar8) {
        local_e8 = *puVar8;
        lStack_e0 = plVar3[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *puVar8;
        local_f8 = (ulong *)*plVar3;
      }
      local_f0 = plVar3[1];
      *plVar3 = (long)puVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      uVar10 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
      uVar12 = -uVar10;
      if (0 < (int)uVar10) {
        uVar12 = uVar10;
      }
      uVar11 = 1;
      if (9 < uVar12) {
        uVar9 = (ulong)uVar12;
        uVar6 = 4;
        do {
          uVar11 = uVar6;
          uVar5 = (uint)uVar9;
          if (uVar5 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_00375173;
          }
          if (uVar5 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_00375173;
          }
          if (uVar5 < 10000) goto LAB_00375173;
          uVar9 = uVar9 / 10000;
          uVar6 = uVar11 + 4;
        } while (99999 < uVar5);
        uVar11 = uVar11 + 1;
      }
LAB_00375173:
      local_198 = local_188;
      std::__cxx11::string::_M_construct
                ((ulong)&local_198,(char)uVar11 - (char)((int)uVar10 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_198),uVar11,uVar12);
      uVar9 = 0xf;
      if (local_f8 != &local_e8) {
        uVar9 = local_e8;
      }
      if (uVar9 < (ulong)(local_190 + local_f0)) {
        uVar9 = 0xf;
        if (local_198 != local_188) {
          uVar9 = local_188[0];
        }
        if (uVar9 < (ulong)(local_190 + local_f0)) goto LAB_003751f0;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_f8);
      }
      else {
LAB_003751f0:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_198);
      }
      local_158 = &local_148;
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_148 = *plVar3;
        uStack_140 = puVar4[3];
      }
      else {
        local_148 = *plVar3;
        local_158 = (long *)*puVar4;
      }
      local_150 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)plVar3 = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_158);
      puVar8 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar8) {
        local_c8 = *puVar8;
        lStack_c0 = plVar3[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *puVar8;
        local_d8 = (ulong *)*plVar3;
      }
      local_d0 = plVar3[1];
      *plVar3 = (long)puVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      uVar10 = 1;
      if (9 < (uint)min) {
        uVar12 = min;
        uVar11 = 4;
        do {
          uVar10 = uVar11;
          if (uVar12 < 100) {
            uVar10 = uVar10 - 2;
            goto LAB_0037531b;
          }
          if (uVar12 < 1000) {
            uVar10 = uVar10 - 1;
            goto LAB_0037531b;
          }
          if (uVar12 < 10000) goto LAB_0037531b;
          bVar2 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          uVar11 = uVar10 + 4;
        } while (bVar2);
        uVar10 = uVar10 + 1;
      }
LAB_0037531b:
      local_118 = local_108;
      std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_118,uVar10,min);
      uVar9 = 0xf;
      if (local_d8 != &local_c8) {
        uVar9 = local_c8;
      }
      if (uVar9 < (ulong)(local_110 + local_d0)) {
        uVar9 = 0xf;
        if (local_118 != local_108) {
          uVar9 = local_108[0];
        }
        if (uVar9 < (ulong)(local_110 + local_d0)) goto LAB_0037539d;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_d8);
      }
      else {
LAB_0037539d:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_118);
      }
      local_138 = &local_128;
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_128 = *plVar3;
        uStack_120 = puVar4[3];
      }
      else {
        local_128 = *plVar3;
        local_138 = (long *)*puVar4;
      }
      local_130 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)plVar3 = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
      plVar7 = plVar3 + 2;
      if ((long *)*plVar3 == plVar7) {
        local_68 = *plVar7;
        lStack_60 = plVar3[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar7;
        local_78 = (long *)*plVar3;
      }
      local_70 = plVar3[1];
      *plVar3 = (long)plVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_118 != local_108) {
        operator_delete(local_118,local_108[0] + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148 + 1);
      }
      if (local_198 != local_188) {
        operator_delete(local_198,local_188[0] + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_178 != &local_168) goto LAB_00374ef8;
      goto LAB_00374f05;
    }
    if ((max < 1) || ((layer->input_).super_RepeatedPtrFieldBase.current_size_ <= max)) {
      Result::Result(__return_storage_ptr__);
      goto LAB_00374f9b;
    }
    plVar3 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    local_98[0] = local_88;
    lVar1 = *plVar3;
    std::__cxx11::string::_M_construct<char*>((string *)local_98,lVar1,plVar3[1] + lVar1);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x3e2432);
    local_b8 = &local_a8;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_a8 = *plVar3;
      lStack_a0 = puVar4[3];
    }
    else {
      local_a8 = *plVar3;
      local_b8 = (long *)*puVar4;
    }
    local_b0 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
    local_1b8 = &local_1a8;
    puVar8 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar8) {
      local_1a8 = *puVar8;
      lStack_1a0 = puVar4[3];
    }
    else {
      local_1a8 = *puVar8;
      local_1b8 = (ulong *)*puVar4;
    }
    local_1b0 = puVar4[1];
    *puVar4 = puVar8;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    uVar10 = layer->_oneof_case_[0];
    uVar12 = -uVar10;
    if (0 < (int)uVar10) {
      uVar12 = uVar10;
    }
    uVar11 = 1;
    if (9 < uVar12) {
      uVar9 = (ulong)uVar12;
      uVar6 = 4;
      do {
        uVar11 = uVar6;
        uVar5 = (uint)uVar9;
        if (uVar5 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00375587;
        }
        if (uVar5 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00375587;
        }
        if (uVar5 < 10000) goto LAB_00375587;
        uVar9 = uVar9 / 10000;
        uVar6 = uVar11 + 4;
      } while (99999 < uVar5);
      uVar11 = uVar11 + 1;
    }
LAB_00375587:
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar11 - (char)((int)uVar10 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_1d8),uVar11,uVar12);
    uVar9 = 0xf;
    if (local_1b8 != &local_1a8) {
      uVar9 = local_1a8;
    }
    if (uVar9 < (ulong)(local_1d0 + local_1b0)) {
      uVar9 = 0xf;
      if (local_1d8 != local_1c8) {
        uVar9 = local_1c8[0];
      }
      if (uVar9 < (ulong)(local_1d0 + local_1b0)) goto LAB_003755fd;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1b8);
    }
    else {
LAB_003755fd:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_1d8);
    }
    local_178 = &local_168;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_168 = *plVar3;
      uStack_160 = puVar4[3];
    }
    else {
      local_168 = *plVar3;
      local_178 = (long *)*puVar4;
    }
    local_170 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_178);
    puVar8 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar8) {
      local_e8 = *puVar8;
      lStack_e0 = plVar3[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar8;
      local_f8 = (ulong *)*plVar3;
    }
    local_f0 = plVar3[1];
    *plVar3 = (long)puVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar10 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
    uVar12 = -uVar10;
    if (0 < (int)uVar10) {
      uVar12 = uVar10;
    }
    uVar11 = 1;
    if (9 < uVar12) {
      uVar9 = (ulong)uVar12;
      uVar6 = 4;
      do {
        uVar11 = uVar6;
        uVar5 = (uint)uVar9;
        if (uVar5 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00375728;
        }
        if (uVar5 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00375728;
        }
        if (uVar5 < 10000) goto LAB_00375728;
        uVar9 = uVar9 / 10000;
        uVar6 = uVar11 + 4;
      } while (99999 < uVar5);
      uVar11 = uVar11 + 1;
    }
LAB_00375728:
    local_198 = local_188;
    std::__cxx11::string::_M_construct((ulong)&local_198,(char)uVar11 - (char)((int)uVar10 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_198),uVar11,uVar12);
    uVar9 = 0xf;
    if (local_f8 != &local_e8) {
      uVar9 = local_e8;
    }
    if (uVar9 < (ulong)(local_190 + local_f0)) {
      uVar9 = 0xf;
      if (local_198 != local_188) {
        uVar9 = local_188[0];
      }
      if (uVar9 < (ulong)(local_190 + local_f0)) goto LAB_003757a6;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_003757a6:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_198);
    }
    local_158 = &local_148;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_148 = *plVar3;
      uStack_140 = puVar4[3];
    }
    else {
      local_148 = *plVar3;
      local_158 = (long *)*puVar4;
    }
    local_150 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_158);
    puVar8 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar8) {
      local_c8 = *puVar8;
      lStack_c0 = plVar3[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *puVar8;
      local_d8 = (ulong *)*plVar3;
    }
    local_d0 = plVar3[1];
    *plVar3 = (long)puVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar10 = 1;
    if (9 < (uint)max) {
      uVar12 = max;
      uVar11 = 4;
      do {
        uVar10 = uVar11;
        if (uVar12 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_003758d5;
        }
        if (uVar12 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_003758d5;
        }
        if (uVar12 < 10000) goto LAB_003758d5;
        bVar2 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        uVar11 = uVar10 + 4;
      } while (bVar2);
      uVar10 = uVar10 + 1;
    }
LAB_003758d5:
    local_118 = local_108;
    std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar10);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_118,uVar10,max);
    uVar9 = 0xf;
    if (local_d8 != &local_c8) {
      uVar9 = local_c8;
    }
    if (uVar9 < (ulong)(local_110 + local_d0)) {
      uVar9 = 0xf;
      if (local_118 != local_108) {
        uVar9 = local_108[0];
      }
      if (uVar9 < (ulong)(local_110 + local_d0)) goto LAB_00375958;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_00375958:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_118);
    }
    local_138 = &local_128;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_128 = *plVar3;
      uStack_120 = puVar4[3];
    }
    else {
      local_128 = *plVar3;
      local_138 = (long *)*puVar4;
    }
    local_130 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_68 = *plVar7;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar7;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if (local_118 != local_108) {
      operator_delete(local_118,local_108[0] + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_98[0] != local_88) goto LAB_00374f76;
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_58);
LAB_00374f9b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInputCount(const Specification::NeuralNetworkLayer& layer, int min, int max) {

    assert( min <= max || max < 0 );
    std::string err;

    if (max > 0 && max == min && layer.input_size() != max) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + " has " + std::to_string(layer.input_size()) + " inputs but expects exactly " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (min > 0 && layer.input_size() < min) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.input_size()) + " inputs but expects at least " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (max > 0 && layer.input_size() > max) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.input_size()) + " inputs but expects at most " + std::to_string(max) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else {
        return Result();
    }
}